

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int aw,int bw,int ap,int bp)

{
  int in_ECX;
  int in_R8D;
  int in_R9D;
  int size;
  int elempack;
  int w;
  int in_stack_0000017c;
  int in_stack_00000180;
  int in_stack_00000184;
  float *in_stack_00000188;
  float *in_stack_00000190;
  float *in_stack_00000198;
  int in_stack_000001f8;
  int in_stack_000001fc;
  float *in_stack_00000200;
  float *in_stack_00000208;
  float *in_stack_00000210;
  int in_stack_00000450;
  int in_stack_00000454;
  float *in_stack_00000458;
  float *in_stack_00000460;
  float *in_stack_00000468;
  int in_stack_00000480;
  int in_stack_00000484;
  float *in_stack_00000488;
  float *in_stack_00000490;
  float *in_stack_00000498;
  int local_24;
  int local_20;
  int local_1c [7];
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c[0] = in_ECX;
  std::max<int>(local_1c,&local_20);
  std::max<int>(&local_24,&size);
  if (local_24 == size) {
    if (local_1c[0] == local_20) {
      binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                (in_stack_00000190,in_stack_00000188,
                 (float *)CONCAT44(in_stack_00000184,in_stack_00000180),in_stack_0000017c);
      return;
    }
    if (local_20 == 1) {
      binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                (in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001fc,
                 in_stack_000001f8);
      return;
    }
    if (local_1c[0] == 1) {
      binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                (in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001fc,
                 in_stack_000001f8);
      return;
    }
  }
  if (size == 1) {
    if (local_1c[0] == local_20) {
      binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                (in_stack_00000498,in_stack_00000490,in_stack_00000488,in_stack_00000484,
                 in_stack_00000480);
    }
    else if (local_20 == 1) {
      binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                (in_stack_00000198,in_stack_00000190,in_stack_00000188,in_stack_00000184,
                 in_stack_00000180);
    }
    else if (local_1c[0] == 1) {
      binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                (in_stack_00000468,in_stack_00000460,in_stack_00000458,in_stack_00000454,
                 in_stack_00000450);
    }
  }
  return;
}

Assistant:

static void binary_op_vector(const float* ptr, const float* ptr1, float* outptr, int aw, int bw, int ap, int bp)
{
    const int w = std::max(aw, bw);
    const int elempack = std::max(ap, bp);
    const int size = w * elempack;

    if (ap == bp)
    {
        if (aw == bw)
        {
            // no broadcast
            return binary_op_vector_no_broadcast<Op>(ptr, ptr1, outptr, size);
        }

        if (bw == 1)
        {
            // broadcast single b
            return binary_op_vector_broadcast_b<Op>(ptr, ptr1, outptr, size, elempack);
        }

        if (aw == 1)
        {
            // broadcast single a
            return binary_op_vector_broadcast_a<Op>(ptr, ptr1, outptr, size, elempack);
        }
    }

    if (bp == 1)
    {
        if (aw == bw)
        {
            // broadcast pack1 b
            return binary_op_vector_broadcast_pb<Op>(ptr, ptr1, outptr, w, elempack);
        }

        if (bw == 1)
        {
            // broadcast pack1 single b
            return binary_op_vector_broadcast_pb_b<Op>(ptr, ptr1, outptr, w, elempack);
        }

        if (aw == 1)
        {
            // broadcast single a and pack1 b
            return binary_op_vector_broadcast_pb_a<Op>(ptr, ptr1, outptr, w, elempack);
        }
    }

    // shall never reach here
}